

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

void __thiscall
t_swift_generator::render_const_value
          (t_swift_generator *this,ostream *out,t_type *type,t_const_value *value)

{
  uint uVar1;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *pmVar2;
  __type _Var3;
  bool bVar4;
  int iVar5;
  t_const_value_type tVar6;
  t_type *ptVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  int64_t iVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  t_swift_generator *this_00;
  char *pcVar12;
  string *psVar13;
  _func_int **pp_Var14;
  _Rb_tree_header *p_Var15;
  t_const_value *value_00;
  undefined1 auVar16 [12];
  string local_d0;
  t_field *local_b0;
  t_type *local_a8;
  t_const_value *local_a0;
  _func_int **local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  ptVar7 = t_type::get_true_type(type);
  iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[5])(ptVar7);
  if ((char)iVar5 == '\0') {
    iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[10])(ptVar7);
    if ((char)iVar5 == '\0') {
      iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0xb])(ptVar7);
      if (((char)iVar5 != '\0') ||
         (iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0xc])(ptVar7), (char)iVar5 != '\0')) {
        local_a0 = value;
        type_name_abi_cxx11_(&local_d0,this,ptVar7,false,false);
        poVar8 = std::operator<<(out,(string *)&local_d0);
        std::operator<<(poVar8,"(");
        std::__cxx11::string::~string((string *)&local_d0);
        pp_Var14 = ptVar7[1].super_t_doc._vptr_t_doc;
        pmVar2 = &local_a0->mapVal_;
        local_a8 = ptVar7;
        while (pp_Var14 != (_func_int **)ptVar7[1].super_t_doc.doc_._M_dataplus._M_p) {
          local_b0 = (t_field *)*pp_Var14;
          psVar13 = &local_b0->name_;
          value_00 = (t_const_value *)0x0;
          local_98 = pp_Var14;
          for (p_Var9 = (local_a0->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var9 != &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
              p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
            std::__cxx11::string::string
                      ((string *)&local_d0,(string *)(*(long *)(p_Var9 + 1) + 0x48));
            _Var3 = std::operator==(psVar13,&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
            if (_Var3) {
              value_00 = (t_const_value *)p_Var9[1]._M_parent;
            }
          }
          if (value_00 == (t_const_value *)0x0) {
            bVar4 = field_is_optional(this,local_b0);
            if (!bVar4) {
              pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              iVar5 = (*(local_a8->super_t_doc)._vptr_t_doc[3])();
              std::operator+(&local_90,"constant error: required field ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var,iVar5));
              std::operator+(&local_70,&local_90,".");
              std::operator+(&local_d0,&local_70,psVar13);
              std::operator+(pbVar11,&local_d0," has no value");
              __cxa_throw(pbVar11,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
          }
          else {
            poVar8 = std::operator<<(out,(string *)psVar13);
            std::operator<<(poVar8,": ");
            render_const_value(this,out,local_b0->type_,value_00);
          }
          ptVar7 = local_a8;
          pp_Var14 = local_98 + 1;
          if (pp_Var14 != (_func_int **)local_a8[1].super_t_doc.doc_._M_dataplus._M_p) {
            std::operator<<(out,", ");
          }
        }
        goto LAB_002b14d0;
      }
      iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0x10])(ptVar7);
      if ((char)iVar5 == '\0') {
        iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0xe])(ptVar7);
        if ((char)iVar5 == '\0') {
          iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0xf])(ptVar7);
          if ((char)iVar5 == '\0') {
            pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[3])(ptVar7);
            std::operator+(pbVar11,"compiler error: no const of type ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_00,iVar5));
            __cxa_throw(pbVar11,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          std::operator<<(out,"[");
          ptVar7 = *(t_type **)&ptVar7[1].super_t_doc.has_doc_;
          p_Var9 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var15 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
          while ((_Rb_tree_header *)p_Var9 != p_Var15) {
            render_const_value(this,out,ptVar7,*(t_const_value **)(p_Var9 + 1));
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
            if ((_Rb_tree_header *)p_Var9 != p_Var15) {
              std::operator<<(out,", ");
            }
          }
        }
        else {
          std::operator<<(out,"[");
          ptVar7 = *(t_type **)&ptVar7[1].super_t_doc.has_doc_;
          p_Var9 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var15 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
          while ((_Rb_tree_header *)p_Var9 != p_Var15) {
            render_const_value(this,out,ptVar7,*(t_const_value **)(p_Var9 + 1));
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
            if ((_Rb_tree_header *)p_Var9 != p_Var15) {
              std::operator<<(out,", ");
            }
          }
        }
        pcVar12 = "]";
      }
      else {
        std::operator<<(out,"[");
        local_b0 = *(t_field **)&ptVar7[1].super_t_doc.has_doc_;
        ptVar7 = *(t_type **)&ptVar7[1].annotations_._M_t._M_impl;
        p_Var9 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var15 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
        while ((_Rb_tree_header *)p_Var9 != p_Var15) {
          render_const_value(this,out,(t_type *)local_b0,*(t_const_value **)(p_Var9 + 1));
          std::operator<<(out,": ");
          render_const_value(this,out,ptVar7,(t_const_value *)p_Var9[1]._M_parent);
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
          if ((_Rb_tree_header *)p_Var9 != p_Var15) {
            std::operator<<(out,", ");
          }
        }
        pcVar12 = "]";
      }
      goto LAB_002b156e;
    }
    bVar4 = this->gen_cocoa_;
    this_00 = (t_swift_generator *)&value->identifierVal_;
    if (bVar4 == true) {
      std::__cxx11::string::string((string *)&local_d0,(string *)this_00);
    }
    else {
      std::__cxx11::string::string((string *)&local_50,(string *)this_00);
      enum_const_name(&local_d0,this_00,&local_50);
    }
    std::operator<<(out,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    if (bVar4 != false) {
      return;
    }
    psVar13 = &local_50;
  }
  else {
    uVar1 = *(uint *)&ptVar7[1].super_t_doc._vptr_t_doc;
    switch(uVar1) {
    case 1:
      poVar8 = std::operator<<(out,"\"");
      t_generator::get_escaped_string_abi_cxx11_(&local_d0,(t_generator *)this,value);
      poVar8 = std::operator<<(poVar8,(string *)&local_d0);
      std::operator<<(poVar8,"\"");
      break;
    case 2:
      iVar10 = t_const_value::get_integer(value);
      pcVar12 = "false";
      if (0 < iVar10) {
        pcVar12 = "true";
      }
LAB_002b156e:
      std::operator<<(out,pcVar12);
      return;
    case 3:
    case 4:
    case 5:
    case 6:
      type_name_abi_cxx11_(&local_d0,this,ptVar7,false,false);
      poVar8 = std::operator<<(out,(string *)&local_d0);
      poVar8 = std::operator<<(poVar8,"(");
      t_const_value::get_integer(value);
      poVar8 = std::ostream::_M_insert<long>((long)poVar8);
      std::operator<<(poVar8,")");
      break;
    case 7:
      type_name_abi_cxx11_(&local_d0,this,ptVar7,false,false);
      poVar8 = std::operator<<(out,(string *)&local_d0);
      std::operator<<(poVar8,"(");
      std::__cxx11::string::~string((string *)&local_d0);
      tVar6 = t_const_value::get_type(value);
      if (tVar6 == CV_INTEGER) {
        t_const_value::get_integer(value);
        std::ostream::_M_insert<long>((long)out);
      }
      else {
        std::ostream::_M_insert<double>(value->doubleVal_);
      }
LAB_002b14d0:
      std::operator<<(out,")");
      return;
    default:
      auVar16 = __cxa_allocate_exception(0x20);
      t_base_type::t_base_name_abi_cxx11_(&local_d0,(t_base_type *)(ulong)uVar1,auVar16._8_4_);
      std::operator+(auVar16._0_8_,"compiler error: no const of base type ",&local_d0);
      __cxa_throw(auVar16._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    psVar13 = &local_d0;
  }
  std::__cxx11::string::~string((string *)psVar13);
  return;
}

Assistant:

void t_swift_generator::render_const_value(ostream& out,
                                           t_type* type,
                                           t_const_value* value) {
  type = get_true_type(type);

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      out << "\"" << get_escaped_string(value) << "\"";
      break;
    case t_base_type::TYPE_BOOL:
      out << ((value->get_integer() > 0) ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      out << type_name(type) << "(" << value->get_integer() << ")";
      break;
    case t_base_type::TYPE_DOUBLE:
      out << type_name(type) << "(";
      if (value->get_type() == t_const_value::CV_INTEGER) {
        out << value->get_integer();
      } else {
        out << value->get_double();
      }
      out << ")";
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    out << (gen_cocoa_ ? value->get_identifier() : enum_const_name(value->get_identifier())); // Swift2/Cocoa compatibility
  } else if (type->is_struct() || type->is_xception()) {

    out << type_name(type) << "(";

    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;

    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (f_iter = fields.begin(); f_iter != fields.end();) {
      t_field* tfield = *f_iter;
      t_const_value* value = nullptr;
      for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
        if (tfield->get_name() == v_iter->first->get_string()) {
          value = v_iter->second;
        }
      }

      if (value) {
        out << tfield->get_name() << ": ";
        render_const_value(out, tfield->get_type(), value);
      }
      else if (!field_is_optional(tfield)) {
        throw "constant error: required field " + type->get_name() + "." + tfield->get_name() + " has no value";
      }

      if (++f_iter != fields.end()) {
        out << ", ";
      }
    }

    out << ")";

  } else if (type->is_map()) {

    out << "[";

    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();

    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (v_iter = val.begin(); v_iter != val.end();) {

      render_const_value(out, ktype, v_iter->first);
      out << ": ";
      render_const_value(out, vtype, v_iter->second);

      if (++v_iter != val.end()) {
        out << ", ";
      }
    }

    out << "]";

  } else if (type->is_list()) {

    out << "[";

    t_type* etype = ((t_list*)type)->get_elem_type();

    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (v_iter = val.begin(); v_iter != val.end();) {

      render_const_value(out, etype, v_iter->first);

      if (++v_iter != val.end()) {
        out << ", ";
      }
    }

    out << "]";

  } else if (type->is_set()) {

    out << "[";

    t_type* etype = ((t_set*)type)->get_elem_type();

    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (v_iter = val.begin(); v_iter != val.end();) {

      render_const_value(out, etype, v_iter->first);

      if (++v_iter != val.end()) {
        out << ", ";
      }
    }

    out << "]";

  } else {
    throw "compiler error: no const of type " + type->get_name();
  }

}